

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

ON_ClassId * __thiscall ON_ClassId::ClassId(ON_ClassId *this,ON_UUID uuid)

{
  int iVar1;
  uchar auVar2 [8];
  undefined1 local_c0 [8];
  ON_UUID sumsrf;
  ON_UUID revsrf;
  ON_UUID br2;
  ON_UUID br1;
  ON_UUID br0;
  ON_UUID pc0;
  ON_UUID ns1;
  ON_UUID ns0;
  ON_UUID nc1;
  ON_UUID nc0;
  ON_ClassId *p;
  ON_UUID uuid_local;
  
  uuid_local._0_8_ = uuid._0_8_;
  nc0.Data4 = (uchar  [8])m_p0;
  p = this;
  while ((nc0.Data4 != (uchar  [8])0x0 &&
         (iVar1 = ON_UuidCompare((ON_UUID *)((long)nc0.Data4 + 0xb8),(ON_UUID *)&p), iVar1 != 0))) {
    nc0.Data4 = *(uchar (*) [8])nc0.Data4;
  }
  if ((nc0.Data4 == (uchar  [8])0x0) && ((g_bDisableDemotion & 1U) == 0)) {
    nc1.Data4[0] = '\x19';
    nc1.Data4[1] = '\x11';
    nc1.Data4[2] = 0xaf;
    nc1.Data4[3] = '^';
    nc1.Data4[4] = 'Q';
    nc1.Data4[5] = '\v';
    nc1.Data4[6] = 0xd4;
    nc1.Data4[7] = '\x11';
    ns0.Data4[0] = 0xd5;
    ns0.Data4[1] = '\t';
    ns0.Data4[2] = 0xa7;
    ns0.Data4[3] = 'v';
    ns0.Data4[4] = 'P';
    ns0.Data4[5] = '\x15';
    ns0.Data4[6] = 0xd4;
    ns0.Data4[7] = '\x11';
    nc1.Data1 = 0x10000080;
    nc1.Data2 = 0x183;
    nc1.Data3 = 0xf022;
    ns1.Data4[0] = '\x17';
    ns1.Data4[1] = 200;
    ns1.Data4[2] = '`';
    ns1.Data4[3] = 'G';
    ns1.Data4[4] = 0xe3;
    ns1.Data4[5] = '\v';
    ns1.Data4[6] = 0xd4;
    ns1.Data4[7] = '\x11';
    ns0.Data1 = 0x1000febf;
    ns0.Data2 = 0x183;
    ns0.Data3 = 0xf022;
    pc0.Data4[0] = 0xb5;
    pc0.Data4[1] = 0xd4;
    pc0.Data4[2] = 'O';
    pc0.Data4[3] = 0xfa;
    pc0.Data4[4] = '\x13';
    pc0.Data4[5] = '\x16';
    pc0.Data4[6] = 0xd4;
    pc0.Data4[7] = '\x11';
    ns1.Data1 = 0x10000080;
    ns1.Data2 = 0x183;
    ns1.Data3 = 0xf022;
    br0.Data4[0] = '\x17';
    br0.Data4[1] = 0x83;
    br0.Data4[2] = 'c';
    br0.Data4[3] = 0xef;
    br0.Data4[4] = 'K';
    br0.Data4[5] = '\x15';
    br0.Data4[6] = 0xd4;
    br0.Data4[7] = '\x11';
    pc0.Data1 = 0x10000080;
    pc0.Data2 = 0x183;
    pc0.Data3 = 0xf022;
    br1.Data4[0] = 0xef;
    br1.Data4[1] = 0xfd;
    br1.Data4[2] = '\x05';
    br1.Data4[3] = '\a';
    br1.Data4[4] = '*';
    br1.Data4[5] = '>';
    br1.Data4[6] = 0xd4;
    br1.Data4[7] = '\x11';
    br0.Data1 = 0x10000e80;
    br0.Data2 = 0x183;
    br0.Data3 = 0xf022;
    br2.Data4[0] = 0xdb;
    br2.Data4[1] = 0xfe;
    br2.Data4[2] = 'L';
    br2.Data4[3] = '-';
    br2.Data4[4] = '*';
    br2.Data4[5] = '>';
    br2.Data4[6] = 0xd4;
    br2.Data4[7] = '\x11';
    br1.Data1 = 0x10000e80;
    br1.Data2 = 0x183;
    br1.Data3 = 0xf022;
    revsrf.Data4[0] = 'C';
    revsrf.Data4[1] = 0xc2;
    revsrf.Data4[2] = 'o';
    revsrf.Data4[3] = 0xf0;
    revsrf.Data4[4] = '*';
    revsrf.Data4[5] = 0xa3;
    revsrf.Data4[6] = '\b';
    revsrf.Data4[7] = 'F';
    br2.Data1 = 0xd2a7d89d;
    br2.Data2 = 0xcec4;
    br2.Data3 = 0x362a;
    sumsrf.Data4[0] = 0xb6;
    sumsrf.Data4[1] = '\x01';
    sumsrf.Data4[2] = 0x84;
    sumsrf.Data4[3] = '\n';
    sumsrf.Data4[4] = '4';
    sumsrf.Data4[5] = 'M';
    sumsrf.Data4[6] = 0x99;
    sumsrf.Data4[7] = 'K';
    revsrf.Data1 = 0x4e1b1586;
    revsrf.Data2 = 0x3d72;
    revsrf.Data3 = 0xe5c4;
    local_c0._0_4_ = 0x665f6331;
    local_c0._4_2_ = 0x2a66;
    local_c0._6_2_ = 0x4cce;
    sumsrf.Data1 = 0xeeb5d081;
    sumsrf.Data2 = 0x9bbd;
    sumsrf.Data3 = 0x1754;
    iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)nc1.Data4);
    if ((iVar1 == 0) || (iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)ns0.Data4), iVar1 == 0)) {
      nc0.Data4 = (uchar  [8])&ON_NurbsCurve::m_ON_NurbsCurve_class_rtti;
    }
    else {
      iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)ns1.Data4);
      if ((iVar1 == 0) || (iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)pc0.Data4), iVar1 == 0))
      {
        nc0.Data4 = (uchar  [8])&ON_NurbsSurface::m_ON_NurbsSurface_class_rtti;
      }
      else {
        iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)br0.Data4);
        if (iVar1 == 0) {
          nc0.Data4 = (uchar  [8])&ON_PolyCurve::m_ON_PolyCurve_class_rtti;
        }
        else {
          iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)br1.Data4);
          if (((iVar1 == 0) ||
              (iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)br2.Data4), iVar1 == 0)) ||
             (iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)revsrf.Data4), iVar1 == 0)) {
            nc0.Data4 = (uchar  [8])&ON_Brep::m_ON_Brep_class_rtti;
          }
          else {
            iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)sumsrf.Data4);
            if (iVar1 == 0) {
              nc0.Data4 = (uchar  [8])&ON_RevSurface::m_ON_RevSurface_class_rtti;
            }
            else {
              iVar1 = ON_UuidCompare((ON_UUID *)&p,(ON_UUID *)local_c0);
              if (iVar1 == 0) {
                nc0.Data4 = (uchar  [8])&ON_SumSurface::m_ON_SumSurface_class_rtti;
              }
              else {
                nc0.Data4[0] = '\0';
                nc0.Data4[1] = '\0';
                nc0.Data4[2] = '\0';
                nc0.Data4[3] = '\0';
                nc0.Data4[4] = '\0';
                nc0.Data4[5] = '\0';
                nc0.Data4[6] = '\0';
                nc0.Data4[7] = '\0';
              }
            }
          }
        }
      }
    }
  }
  auVar2[0] = nc0.Data4[0];
  auVar2[1] = nc0.Data4[1];
  auVar2[2] = nc0.Data4[2];
  auVar2[3] = nc0.Data4[3];
  auVar2[4] = nc0.Data4[4];
  auVar2[5] = nc0.Data4[5];
  auVar2[6] = nc0.Data4[6];
  auVar2[7] = nc0.Data4[7];
  return (ON_ClassId *)auVar2;
}

Assistant:

const ON_ClassId* ON_ClassId::ClassId( ON_UUID uuid )
{
  // static member function
  // search list of class ids for one with a matching typecode
  const ON_ClassId* p;
  for(p = m_p0; p; p = p->m_pNext) 
  {
    if ( !ON_UuidCompare(&p->m_uuid,&uuid) )
      break;
  }

  if ( nullptr == p && false == g_bDisableDemotion) 
  {
    // enable OpenNURBS toolkit to read files that contain old uuids even when
    // old class definitions are not loaded.

    // 5EAF1119-0B51-11d4-BFFE-0010830122F0 = TL_NurbsCurve
    ON_UUID nc0 = {0x5EAF1119,0x0B51,0x11d4,{0xBF,0xFE,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // 76A709D5-1550-11d4-8000-0010830122F0 = old nurbs curve
    ON_UUID nc1 = {0x76A709D5,0x1550,0x11d4,{0x80,0x00,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // 4760C817-0BE3-11d4-BFFE-0010830122F0 = TL_NurbsSurface
    ON_UUID ns0 = {0x4760C817,0x0BE3,0x11d4,{0xBF,0xFE,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // FA4FD4B5-1613-11d4-8000-0010830122F0 = old nurbs surface
    ON_UUID ns1 = {0xFA4FD4B5,0x1613,0x11d4,{0x80,0x00,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // EF638317-154B-11d4-8000-0010830122F0 = old poly curve
    ON_UUID pc0 = {0xEF638317,0x154B,0x11d4,{0x80,0x00,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // 0705FDEF-3E2A-11d4-800E-0010830122F0 = old trimmed surface
    ON_UUID br0 = {0x0705FDEF,0x3E2A,0x11d4,{0x80,0x0E,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // 2D4CFEDB-3E2A-11d4-800E-0010830122F0 = old b-rep
    ON_UUID br1 = {0x2D4CFEDB,0x3E2A,0x11d4,{0x80,0x0E,  0x00,0x10,0x83,0x01,0x22,0xF0}};

    // F06FC243-A32A-4608-9DD8-A7D2C4CE2A36 = TL_Brep
    ON_UUID br2 = {0xF06FC243,0xA32A,0x4608,{0x9D,0xD8, 0xA7,0xD2,0xC4,0xCE,0x2A,0x36}};

    // 0A8401B6-4D34-4b99-8615-1B4E723DC4E5 = TL_RevSurface
    ON_UUID revsrf = { 0xa8401b6, 0x4d34, 0x4b99, { 0x86, 0x15, 0x1b, 0x4e, 0x72, 0x3d, 0xc4, 0xe5 } };

    // 665F6331-2A66-4cce-81D0-B5EEBD9B5417 = TL_SumSurface
    ON_UUID sumsrf = { 0x665f6331, 0x2a66, 0x4cce, { 0x81, 0xd0, 0xb5, 0xee, 0xbd, 0x9b, 0x54, 0x17 } };

    if      ( !ON_UuidCompare( &uuid, &nc0 ) || !ON_UuidCompare( &uuid, &nc1 ) )
      p = &ON_CLASS_RTTI(ON_NurbsCurve);
    else if ( !ON_UuidCompare( &uuid, &ns0 ) || !ON_UuidCompare( &uuid, &ns1 ) )
      p = &ON_CLASS_RTTI(ON_NurbsSurface);
    else if ( !ON_UuidCompare( &uuid, &pc0 ) )
      p = &ON_CLASS_RTTI(ON_PolyCurve);
    else if ( !ON_UuidCompare( &uuid, &br0 ) || !ON_UuidCompare( &uuid, &br1 ) || !ON_UuidCompare( &uuid, &br2 ) )
      p = &ON_CLASS_RTTI(ON_Brep);
    else if ( !ON_UuidCompare( &uuid, &revsrf ) )
      p = &ON_CLASS_RTTI(ON_RevSurface);
    else if ( !ON_UuidCompare( &uuid, &sumsrf ) )
      p = &ON_CLASS_RTTI(ON_SumSurface);
    else
    {
      // The p = nullptr line does nothing (p is already nullptr) but, if you're working on
      // file reading bugs or other cases that involving rtti bugs, then it's a good 
      // location for a debugger breakpoint.
      p = nullptr;
    }
  }
  return p;
}